

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSet::Deserialize(LogicalSet *this,Deserializer *deserializer)

{
  SetScope scope_p;
  int iVar1;
  LogicalSet *this_00;
  type ret;
  string str;
  Value value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  char *local_c8 [2];
  char local_b8 [16];
  Value local_a8;
  Value local_68;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_108 = &local_f8;
    local_f8._M_local_buf[0] = '\0';
    local_100 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_108,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_a8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"scope");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_c8,deserializer);
    scope_p = EnumUtil::FromString<duckdb::SetScope>(local_c8[0]);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    scope_p = (SetScope)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (LogicalSet *)operator_new(0xd0);
  if (local_108 == &local_f8) {
    local_e8.field_2._8_8_ = local_f8._8_8_;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)local_108;
  }
  local_e8.field_2._M_allocated_capacity._1_7_ = local_f8._M_allocated_capacity._1_7_;
  local_e8.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
  local_e8._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_108 = &local_f8;
  Value::Value(&local_68,&local_a8);
  LogicalSet(this_00,&local_e8,&local_68,scope_p);
  Value::~Value(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  Value::~Value(&local_a8);
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSet::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(200, "name");
	auto value = deserializer.ReadProperty<Value>(201, "value");
	auto scope = deserializer.ReadProperty<SetScope>(202, "scope");
	auto result = duckdb::unique_ptr<LogicalSet>(new LogicalSet(std::move(name), value, scope));
	return std::move(result);
}